

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ClearLabelCase::iterate(ClearLabelCase *this)

{
  bool bVar1;
  deBool dVar2;
  int iVar3;
  NotSupportedError *this_00;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  Enum<int,_2UL> EVar7;
  MessageBuilder local_14f8;
  allocator<char> local_1371;
  string local_1370;
  string local_1350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1330;
  GetNameFunc local_1310;
  int local_1308;
  GetNameFunc local_1300;
  int local_12f8;
  string local_12f0;
  allocator<char> local_12c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1268;
  int local_1244;
  undefined1 local_1240 [4];
  deUint32 err_7;
  GetNameFunc local_10c0;
  int local_10b8;
  GetNameFunc local_10b0;
  int local_10a8;
  string local_10a0;
  allocator<char> local_1079;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1078;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1058;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1038;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1018;
  int local_ff4;
  undefined1 local_ff0 [4];
  deUint32 err_6;
  GetNameFunc local_e70;
  int local_e68;
  GetNameFunc local_e60;
  int local_e58;
  string local_e50;
  allocator<char> local_e29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_de8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dc8;
  int local_da4;
  undefined1 local_da0 [4];
  deUint32 err_5;
  int local_c20;
  allocator<char> local_c19;
  int methodNdx_1;
  allocator<char> local_bf1;
  string local_bf0;
  ScopedLogSection local_bd0;
  ScopedLogSection section_1;
  allocator<char> local_a41;
  string local_a40;
  string local_a20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a00;
  GetNameFunc local_9e0;
  int local_9d8;
  GetNameFunc local_9d0;
  int local_9c8;
  string local_9c0;
  allocator<char> local_999;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_998;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_978;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_958;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_938;
  int local_914;
  undefined1 local_910 [4];
  deUint32 err_4;
  GetNameFunc local_790;
  int local_788;
  GetNameFunc local_780;
  int local_778;
  string local_770;
  allocator<char> local_749;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_748;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_728;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  int local_6c4;
  undefined1 local_6c0 [4];
  deUint32 err_3;
  GetNameFunc local_540;
  int local_538;
  GetNameFunc local_530;
  int local_528;
  string local_520;
  allocator<char> local_4f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  int local_474;
  undefined1 local_470 [4];
  deUint32 err_2;
  int local_2f0;
  allocator<char> local_2e9;
  int methodNdx;
  allocator<char> local_2c1;
  string local_2c0;
  ScopedLogSection local_2a0;
  ScopedLogSection section;
  TestLog *local_288;
  int local_280;
  string local_278;
  allocator<char> local_251;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  int local_1cc;
  GetNameFunc p_Stack_1c8;
  deUint32 err_1;
  int local_1c0;
  GetNameFunc local_1b8;
  int local_1b0;
  string local_1a8;
  allocator<char> local_181;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  int local_fc;
  char local_f8 [4];
  deUint32 err;
  char buffer [64];
  GLsync sync;
  GLuint shader;
  int outlen;
  char *msg;
  string local_98;
  undefined1 local_78 [8];
  ResultCollector result;
  Functions *gl;
  ClearLabelCase *this_local;
  
  while ((dVar2 = ::deGetFalse(), dVar2 == 0 &&
         (bVar1 = isKHRDebugSupported((this->super_TestCase).m_context), bVar1))) {
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      pRVar4 = Context::getRenderContext((this->super_TestCase).m_context);
      iVar3 = (*pRVar4->_vptr_RenderContext[3])();
      result.m_message.field_2._8_8_ = CONCAT44(extraout_var,iVar3);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98," // ERROR: ",(allocator<char> *)((long)&msg + 7));
      tcu::ResultCollector::ResultCollector((ResultCollector *)local_78,pTVar5,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator((allocator<char> *)((long)&msg + 7));
      _shader = "This is a debug label";
      sync._4_4_ = -1;
      buffer._56_8_ = (**(code **)(result.m_message.field_2._8_8_ + 0x640))(0x9117,0);
      do {
        local_fc = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_fc != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_180,"Got Error ",&local_181);
          EVar7 = glu::getErrorStr(local_fc);
          p_Stack_1c8 = EVar7.m_getName;
          local_1c0 = EVar7.m_value;
          local_1b8 = p_Stack_1c8;
          local_1b0 = local_1c0;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_1a8,&local_1b8);
          std::operator+(&local_160,&local_180,&local_1a8);
          std::operator+(&local_140,&local_160,": ");
          std::operator+(&local_120,&local_140,"fenceSync");
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_120);
          std::__cxx11::string::~string((string *)&local_120);
          std::__cxx11::string::~string((string *)&local_140);
          std::__cxx11::string::~string((string *)&local_160);
          std::__cxx11::string::~string((string *)&local_1a8);
          std::__cxx11::string::~string((string *)&local_180);
          std::allocator<char>::~allocator(&local_181);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      sync._0_4_ = (**(code **)(result.m_message.field_2._8_8_ + 0x3f0))(0x8b30);
      do {
        local_1cc = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_1cc != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_250,"Got Error ",&local_251);
          EVar7 = glu::getErrorStr(local_1cc);
          section.m_log = (TestLog *)EVar7.m_getName;
          local_280 = EVar7.m_value;
          local_288 = section.m_log;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_278,&local_288);
          std::operator+(&local_230,&local_250,&local_278);
          std::operator+(&local_210,&local_230,": ");
          std::operator+(&local_1f0,&local_210,"createShader");
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_1f0);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::__cxx11::string::~string((string *)&local_210);
          std::__cxx11::string::~string((string *)&local_230);
          std::__cxx11::string::~string((string *)&local_278);
          std::__cxx11::string::~string((string *)&local_250);
          std::allocator<char>::~allocator(&local_251);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"Shader",&local_2c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&methodNdx,"Shader object",&local_2e9);
      tcu::ScopedLogSection::ScopedLogSection(&local_2a0,pTVar5,&local_2c0,(string *)&methodNdx);
      std::__cxx11::string::~string((string *)&methodNdx);
      std::allocator<char>::~allocator(&local_2e9);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::allocator<char>::~allocator(&local_2c1);
      for (local_2f0 = 0; local_2f0 < 3; local_2f0 = local_2f0 + 1) {
        pTVar5 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)local_470,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_470,(char (*) [27])"Setting label to string: \""
                           );
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char **)&shader);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0xf09e4c);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_470);
        (**(code **)(result.m_message.field_2._8_8_ + 0xfc0))
                  (0x82e1,sync._0_4_,0xfffffffe,"This is a debug label");
        do {
          local_474 = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
          if (local_474 != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4f8,"Got Error ",&local_4f9);
            EVar7 = glu::getErrorStr(local_474);
            local_540 = EVar7.m_getName;
            local_538 = EVar7.m_value;
            local_530 = local_540;
            local_528 = local_538;
            tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_520,&local_530);
            std::operator+(&local_4d8,&local_4f8,&local_520);
            std::operator+(&local_4b8,&local_4d8,": ");
            std::operator+(&local_498,&local_4b8,"objectLabel");
            tcu::ResultCollector::fail((ResultCollector *)local_78,&local_498);
            std::__cxx11::string::~string((string *)&local_498);
            std::__cxx11::string::~string((string *)&local_4b8);
            std::__cxx11::string::~string((string *)&local_4d8);
            std::__cxx11::string::~string((string *)&local_520);
            std::__cxx11::string::~string((string *)&local_4f8);
            std::allocator<char>::~allocator(&local_4f9);
          }
          dVar2 = ::deGetFalse();
        } while (dVar2 != 0);
        pTVar5 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)local_6c0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_6c0,(char (*) [16])"Clearing label ");
        pMVar6 = tcu::MessageBuilder::operator<<
                           (pMVar6,&iterate::s_clearMethods[local_2f0].description);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_6c0);
        (**(code **)(result.m_message.field_2._8_8_ + 0xfc0))
                  (0x82e1,sync._0_4_,iterate::s_clearMethods[local_2f0].length,0);
        do {
          local_6c4 = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
          if (local_6c4 != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_748,"Got Error ",&local_749);
            EVar7 = glu::getErrorStr(local_6c4);
            local_790 = EVar7.m_getName;
            local_788 = EVar7.m_value;
            local_780 = local_790;
            local_778 = local_788;
            tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_770,&local_780);
            std::operator+(&local_728,&local_748,&local_770);
            std::operator+(&local_708,&local_728,": ");
            std::operator+(&local_6e8,&local_708,"objectLabel");
            tcu::ResultCollector::fail((ResultCollector *)local_78,&local_6e8);
            std::__cxx11::string::~string((string *)&local_6e8);
            std::__cxx11::string::~string((string *)&local_708);
            std::__cxx11::string::~string((string *)&local_728);
            std::__cxx11::string::~string((string *)&local_770);
            std::__cxx11::string::~string((string *)&local_748);
            std::allocator<char>::~allocator(&local_749);
          }
          dVar2 = ::deGetFalse();
        } while (dVar2 != 0);
        pTVar5 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)local_910,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_910,(char (*) [15])"Querying label");
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_910);
        local_f8[0] = 'X';
        sync._4_4_ = -1;
        (**(code **)(result.m_message.field_2._8_8_ + 0x958))
                  (0x82e1,sync._0_4_,0x40,(long)&sync + 4,local_f8);
        do {
          local_914 = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
          if (local_914 != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_998,"Got Error ",&local_999);
            EVar7 = glu::getErrorStr(local_914);
            local_9e0 = EVar7.m_getName;
            local_9d8 = EVar7.m_value;
            local_9d0 = local_9e0;
            local_9c8 = local_9d8;
            tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_9c0,&local_9d0);
            std::operator+(&local_978,&local_998,&local_9c0);
            std::operator+(&local_958,&local_978,": ");
            std::operator+(&local_938,&local_958,"getObjectLabel");
            tcu::ResultCollector::fail((ResultCollector *)local_78,&local_938);
            std::__cxx11::string::~string((string *)&local_938);
            std::__cxx11::string::~string((string *)&local_958);
            std::__cxx11::string::~string((string *)&local_978);
            std::__cxx11::string::~string((string *)&local_9c0);
            std::__cxx11::string::~string((string *)&local_998);
            std::allocator<char>::~allocator(&local_999);
          }
          dVar2 = ::deGetFalse();
        } while (dVar2 != 0);
        if (sync._4_4_ == 0) {
          if (local_f8[0] == '\0') {
            pTVar5 = tcu::TestContext::getLog
                               ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<
                      ((MessageBuilder *)&section_1,pTVar5,
                       (BeginMessageToken *)&tcu::TestLog::Message);
            pMVar6 = tcu::MessageBuilder::operator<<
                               ((MessageBuilder *)&section_1,
                                (char (*) [36])"Got 0-sized null-terminated string.");
            tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&section_1);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_a40,"label was not null terminated",&local_a41);
            tcu::ResultCollector::fail((ResultCollector *)local_78,&local_a40);
            std::__cxx11::string::~string((string *)&local_a40);
            std::allocator<char>::~allocator(&local_a41);
          }
        }
        else {
          de::toString<int>(&local_a20,(int *)((long)&sync + 4));
          std::operator+(&local_a00,"\'length\' was not zero, got ",&local_a20);
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_a00);
          std::__cxx11::string::~string((string *)&local_a00);
          std::__cxx11::string::~string((string *)&local_a20);
        }
      }
      tcu::ScopedLogSection::~ScopedLogSection(&local_2a0);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_bf0,"Sync",&local_bf1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&methodNdx_1,"Sync object",&local_c19);
      tcu::ScopedLogSection::ScopedLogSection(&local_bd0,pTVar5,&local_bf0,(string *)&methodNdx_1);
      std::__cxx11::string::~string((string *)&methodNdx_1);
      std::allocator<char>::~allocator(&local_c19);
      std::__cxx11::string::~string((string *)&local_bf0);
      std::allocator<char>::~allocator(&local_bf1);
      for (local_c20 = 0; local_c20 < 3; local_c20 = local_c20 + 1) {
        pTVar5 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)local_da0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_da0,(char (*) [27])"Setting label to string: \""
                           );
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char **)&shader);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0xf09e4c);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_da0);
        (**(code **)(result.m_message.field_2._8_8_ + 0xfc8))
                  (buffer._56_8_,0xfffffffe,"This is a debug label");
        do {
          local_da4 = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
          if (local_da4 != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_e28,"Got Error ",&local_e29);
            EVar7 = glu::getErrorStr(local_da4);
            local_e70 = EVar7.m_getName;
            local_e68 = EVar7.m_value;
            local_e60 = local_e70;
            local_e58 = local_e68;
            tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_e50,&local_e60);
            std::operator+(&local_e08,&local_e28,&local_e50);
            std::operator+(&local_de8,&local_e08,": ");
            std::operator+(&local_dc8,&local_de8,"objectPtrLabel");
            tcu::ResultCollector::fail((ResultCollector *)local_78,&local_dc8);
            std::__cxx11::string::~string((string *)&local_dc8);
            std::__cxx11::string::~string((string *)&local_de8);
            std::__cxx11::string::~string((string *)&local_e08);
            std::__cxx11::string::~string((string *)&local_e50);
            std::__cxx11::string::~string((string *)&local_e28);
            std::allocator<char>::~allocator(&local_e29);
          }
          dVar2 = ::deGetFalse();
        } while (dVar2 != 0);
        pTVar5 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)local_ff0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_ff0,(char (*) [16])"Clearing label ");
        pMVar6 = tcu::MessageBuilder::operator<<
                           (pMVar6,&iterate::s_clearMethods[local_c20].description);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_ff0);
        (**(code **)(result.m_message.field_2._8_8_ + 0xfc8))
                  (buffer._56_8_,iterate::s_clearMethods[local_c20].length,0);
        do {
          local_ff4 = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
          if (local_ff4 != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1078,"Got Error ",&local_1079);
            EVar7 = glu::getErrorStr(local_ff4);
            local_10c0 = EVar7.m_getName;
            local_10b8 = EVar7.m_value;
            local_10b0 = local_10c0;
            local_10a8 = local_10b8;
            tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_10a0,&local_10b0);
            std::operator+(&local_1058,&local_1078,&local_10a0);
            std::operator+(&local_1038,&local_1058,": ");
            std::operator+(&local_1018,&local_1038,"objectPtrLabel");
            tcu::ResultCollector::fail((ResultCollector *)local_78,&local_1018);
            std::__cxx11::string::~string((string *)&local_1018);
            std::__cxx11::string::~string((string *)&local_1038);
            std::__cxx11::string::~string((string *)&local_1058);
            std::__cxx11::string::~string((string *)&local_10a0);
            std::__cxx11::string::~string((string *)&local_1078);
            std::allocator<char>::~allocator(&local_1079);
          }
          dVar2 = ::deGetFalse();
        } while (dVar2 != 0);
        pTVar5 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)local_1240,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_1240,(char (*) [15])"Querying label");
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1240);
        local_f8[0] = 'X';
        sync._4_4_ = -1;
        (**(code **)(result.m_message.field_2._8_8_ + 0x960))
                  (buffer._56_8_,0x40,(long)&sync + 4,local_f8);
        do {
          local_1244 = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
          if (local_1244 != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_12c8,"Got Error ",&local_12c9);
            EVar7 = glu::getErrorStr(local_1244);
            local_1310 = EVar7.m_getName;
            local_1308 = EVar7.m_value;
            local_1300 = local_1310;
            local_12f8 = local_1308;
            tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_12f0,&local_1300);
            std::operator+(&local_12a8,&local_12c8,&local_12f0);
            std::operator+(&local_1288,&local_12a8,": ");
            std::operator+(&local_1268,&local_1288,"getObjectPtrLabel");
            tcu::ResultCollector::fail((ResultCollector *)local_78,&local_1268);
            std::__cxx11::string::~string((string *)&local_1268);
            std::__cxx11::string::~string((string *)&local_1288);
            std::__cxx11::string::~string((string *)&local_12a8);
            std::__cxx11::string::~string((string *)&local_12f0);
            std::__cxx11::string::~string((string *)&local_12c8);
            std::allocator<char>::~allocator(&local_12c9);
          }
          dVar2 = ::deGetFalse();
        } while (dVar2 != 0);
        if (sync._4_4_ == 0) {
          if (local_f8[0] == '\0') {
            pTVar5 = tcu::TestContext::getLog
                               ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_14f8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar6 = tcu::MessageBuilder::operator<<
                               (&local_14f8,(char (*) [36])"Got 0-sized null-terminated string.");
            tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_14f8);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1370,"label was not null terminated",&local_1371);
            tcu::ResultCollector::fail((ResultCollector *)local_78,&local_1370);
            std::__cxx11::string::~string((string *)&local_1370);
            std::allocator<char>::~allocator(&local_1371);
          }
        }
        else {
          de::toString<int>(&local_1350,(int *)((long)&sync + 4));
          std::operator+(&local_1330,"\'length\' was not zero, got ",&local_1350);
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_1330);
          std::__cxx11::string::~string((string *)&local_1330);
          std::__cxx11::string::~string((string *)&local_1350);
        }
      }
      tcu::ScopedLogSection::~ScopedLogSection(&local_bd0);
      (**(code **)(result.m_message.field_2._8_8_ + 0x470))(sync._0_4_);
      (**(code **)(result.m_message.field_2._8_8_ + 0x478))(buffer._56_8_);
      tcu::ResultCollector::setTestContextResult
                ((ResultCollector *)local_78,
                 (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::ResultCollector::~ResultCollector((ResultCollector *)local_78);
      return STOP;
    }
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"GL_KHR_debug is not supported","isKHRDebugSupported(m_context)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
             ,0x79e);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

ClearLabelCase::IterateResult ClearLabelCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, isKHRDebugSupported(m_context), "GL_KHR_debug is not supported");

	static const struct
	{
		const char*	description;
		int			length;
	} s_clearMethods[] =
	{
		{ " with NULL label and 0 length",			0	},
		{ " with NULL label and 1 length",			1	},
		{ " with NULL label and negative length",	-1	},
	};

	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	tcu::ResultCollector	result		(m_testCtx.getLog(), " // ERROR: ");
	const char*	const		msg			= "This is a debug label";
	int						outlen		= -1;
	GLuint					shader;
	glw::GLsync				sync;
	char					buffer[64];

	sync = gl.fenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "fenceSync");

	shader = gl.createShader(GL_FRAGMENT_SHADER);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "createShader");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Shader", "Shader object");

		for (int methodNdx = 0; methodNdx < DE_LENGTH_OF_ARRAY(s_clearMethods); ++methodNdx)
		{
			m_testCtx.getLog() << TestLog::Message << "Setting label to string: \"" << msg << "\"" << TestLog::EndMessage;
			gl.objectLabel(GL_SHADER, shader, -2,  msg);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectLabel");

			m_testCtx.getLog() << TestLog::Message << "Clearing label " << s_clearMethods[methodNdx].description << TestLog::EndMessage;
			gl.objectLabel(GL_SHADER, shader, s_clearMethods[methodNdx].length, DE_NULL);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectLabel");

			m_testCtx.getLog() << TestLog::Message << "Querying label" << TestLog::EndMessage;
			buffer[0] = 'X';
			outlen = -1;
			gl.getObjectLabel(GL_SHADER, shader, sizeof(buffer), &outlen, buffer);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectLabel");

			if (outlen != 0)
				result.fail("'length' was not zero, got " + de::toString(outlen));
			else if (buffer[0] != '\0')
				result.fail("label was not null terminated");
			else
				m_testCtx.getLog() << TestLog::Message << "Got 0-sized null-terminated string." << TestLog::EndMessage;
		}
	}

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Sync", "Sync object");

		for (int methodNdx = 0; methodNdx < DE_LENGTH_OF_ARRAY(s_clearMethods); ++methodNdx)
		{
			m_testCtx.getLog() << TestLog::Message << "Setting label to string: \"" << msg << "\"" << TestLog::EndMessage;
			gl.objectPtrLabel(sync, -2, msg);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectPtrLabel");

			m_testCtx.getLog() << TestLog::Message << "Clearing label " << s_clearMethods[methodNdx].description << TestLog::EndMessage;
			gl.objectPtrLabel(sync, s_clearMethods[methodNdx].length, DE_NULL);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectPtrLabel");

			m_testCtx.getLog() << TestLog::Message << "Querying label" << TestLog::EndMessage;
			buffer[0] = 'X';
			outlen = -1;
			gl.getObjectPtrLabel(sync, sizeof(buffer), &outlen, buffer);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectPtrLabel");

			if (outlen != 0)
				result.fail("'length' was not zero, got " + de::toString(outlen));
			else if (buffer[0] != '\0')
				result.fail("label was not null terminated");
			else
				m_testCtx.getLog() << TestLog::Message << "Got 0-sized null-terminated string." << TestLog::EndMessage;
		}
	}

	gl.deleteShader(shader);
	gl.deleteSync(sync);

	result.setTestContextResult(m_testCtx);
	return STOP;
}